

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

Wlc_Ntk_t * Wlc_ReadNdr(char *pFileName)

{
  FILE *__stream;
  ulong uVar1;
  int *pData;
  void *__ptr;
  int *__ptr_00;
  Wlc_Ntk_t *pWVar2;
  Abc_Frame_t *pAbc;
  int iVar3;
  size_t __size;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pData = (int *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    pData = (int *)0x0;
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    uVar1 = (ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff;
    if ((int)((long)uVar1 % 5) == 0) {
      rewind(__stream);
      pData = (int *)malloc(0x18);
      iVar3 = (int)((long)uVar1 / 5);
      pData[1] = iVar3;
      *pData = iVar3;
      __size = (size_t)iVar3;
      __ptr = malloc(__size);
      *(void **)(pData + 2) = __ptr;
      __ptr_00 = (int *)malloc((long)(iVar3 * 4) << 2);
      *(int **)(pData + 4) = __ptr_00;
      fread(__ptr_00,4,__size,__stream);
      fread(__ptr,1,__size,__stream);
      if (iVar3 != *__ptr_00) {
        __assert_fail("p->nSize == (int)p->pBody[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x25f,"void *Ndr_Read(char *)");
      }
      fclose(__stream);
    }
  }
  pWVar2 = Wlc_NtkFromNdr(pData);
  pAbc = Abc_FrameGetGlobalFrame();
  Abc_FrameInputNdr(pAbc,pData);
  return pWVar2;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadNdr( char * pFileName )
{
    void * pData = Ndr_Read( pFileName );
    Wlc_Ntk_t * pNtk = Wlc_NtkFromNdr( pData );
    //char * ppNames[10] = { NULL, "a", "b", "c", "d", "e", "f", "g", "h", "i" };
    //Ndr_WriteVerilog( NULL, pData, ppNames );
    //Ndr_Delete( pData );
    Abc_FrameInputNdr( Abc_FrameGetGlobalFrame(), pData );
    return pNtk;
}